

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateCheckForArgumentsLength
          (Lowerer *this,Instr *ldElem,LabelInstr *labelCreateHeapArgs,Opnd *actualParamOpnd,
          Opnd *valueOpnd,OpCode opcode)

{
  OpCode opcode_local;
  Opnd *valueOpnd_local;
  Opnd *actualParamOpnd_local;
  LabelInstr *labelCreateHeapArgs_local;
  Instr *ldElem_local;
  Lowerer *this_local;
  
  InsertCompare(actualParamOpnd,valueOpnd,ldElem);
  InsertBranch(opcode,true,labelCreateHeapArgs,ldElem);
  return;
}

Assistant:

void
Lowerer::GenerateCheckForArgumentsLength(IR::Instr* ldElem, IR::LabelInstr* labelCreateHeapArgs, IR::Opnd* actualParamOpnd, IR::Opnd* valueOpnd, Js::OpCode opcode)
{
    // Check if index < nr_actuals.
    InsertCompare(actualParamOpnd, valueOpnd, ldElem);
    // Jump to helper if index >= nr_actuals.
    // Do an unsigned check here so that a negative index will also fail.
    // (GenerateLdValueFromCheckedIndexOpnd does not guarantee positive index on x86.)
    InsertBranch(opcode, true, labelCreateHeapArgs, ldElem);
}